

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xModule.c
# Opt level: O0

cs_err TMS320C64x_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  TMS320C64x_init(in_stack_00000020);
  *(code **)(in_RDI + 8) = TMS320C64x_printInst;
  *(void **)(in_RDI + 0x10) = pvVar1;
  *(void **)(in_RDI + 0x20) = pvVar1;
  *(code **)(in_RDI + 0x18) = TMS320C64x_getInstruction;
  *(code **)(in_RDI + 0x48) = TMS320C64x_post_printer;
  *(code **)(in_RDI + 0x28) = TMS320C64x_reg_name;
  *(code **)(in_RDI + 0x40) = TMS320C64x_get_insn_id;
  *(code **)(in_RDI + 0x30) = TMS320C64x_insn_name;
  *(code **)(in_RDI + 0x38) = TMS320C64x_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err TMS320C64x_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	mri = cs_mem_malloc(sizeof(*mri));

	TMS320C64x_init(mri);
	ud->printer = TMS320C64x_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = TMS320C64x_getInstruction;
	ud->post_printer = TMS320C64x_post_printer;

	ud->reg_name = TMS320C64x_reg_name;
	ud->insn_id = TMS320C64x_get_insn_id;
	ud->insn_name = TMS320C64x_insn_name;
	ud->group_name = TMS320C64x_group_name;

	return CS_ERR_OK;
}